

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<kj::_::AttachmentPromiseNode<kj::Own<kj::WebSocket>_>_> __thiscall
kj::
heap<kj::_::AttachmentPromiseNode<kj::Own<kj::WebSocket>>,kj::Own<kj::_::PromiseNode>,kj::Own<kj::WebSocket>>
          (kj *this,Own<kj::_::PromiseNode> *params,Own<kj::WebSocket> *params_1)

{
  AttachmentPromiseNode<kj::Own<kj::WebSocket>_> *this_00;
  AttachmentPromiseNode<kj::Own<kj::WebSocket>_> *extraout_RDX;
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::WebSocket>_>_> OVar1;
  
  this_00 = (AttachmentPromiseNode<kj::Own<kj::WebSocket>_> *)operator_new(0x28);
  _::AttachmentPromiseNode<kj::Own<kj::WebSocket>_>::AttachmentPromiseNode(this_00,params,params_1);
  *(undefined8 **)this =
       &_::HeapDisposer<kj::_::AttachmentPromiseNode<kj::Own<kj::WebSocket>>>::instance;
  *(AttachmentPromiseNode<kj::Own<kj::WebSocket>_> **)(this + 8) = this_00;
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}